

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<void>::operator()<>
          (Build_Function_Caller_Helper<void> *this)

{
  Type_Conversions *this_00;
  Type_Conversions_State state_1;
  Type_Conversions_State state;
  Function_Params local_e8;
  Function_Params local_d8;
  pthread_rwlock_t local_c8;
  _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  _Stack_90;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  _Stack_60;
  undefined8 uStack_30;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  local_28;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_20 [2];
  
  this_00 = this->m_conversions;
  if (this_00 == (Type_Conversions *)0x0) {
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_90._M_impl.super__Rb_tree_header._M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._48_8_ = 0;
    _Stack_90._M_impl._0_8_ = 0;
    local_c8._32_8_ = 0;
    local_c8.__data.__pad2 = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_60._M_impl.super__Rb_tree_header._M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl._0_8_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    uStack_30 = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e8.m_end =
         (Boxed_Value *)Type_Conversions::conversion_saves((Type_Conversions *)&local_c8.__data);
    local_d8.m_begin = (Boxed_Value *)0x0;
    local_d8.m_end = (Boxed_Value *)0x0;
    local_e8.m_begin = (Boxed_Value *)&local_c8;
    call(this,&local_d8,(Type_Conversions_State *)&local_e8);
    chaiscript::detail::threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::
    ~Thread_Storage(local_20);
    chaiscript::detail::threading::
    Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
    ::~Thread_Storage(&local_28);
    Catch::clara::std::
    _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::~_Rb_tree(&_Stack_60);
    Catch::clara::std::
    _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
    ::~_Rb_tree(&_Stack_90);
  }
  else {
    local_c8._8_8_ = Type_Conversions::conversion_saves(this_00);
    local_e8.m_begin = (Boxed_Value *)0x0;
    local_e8.m_end = (Boxed_Value *)0x0;
    local_c8.__align = (long)this_00;
    call(this,&local_e8,(Type_Conversions_State *)&local_c8.__data);
  }
  return;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }